

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O2

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  int iVar1;
  int iVar2;
  CompressorScheme CVar3;
  ChannelData *pCVar4;
  exr_coding_channel_info_t *peVar5;
  uint8_t *puVar6;
  int i;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  uint8_t *puVar14;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
    alStack_48[lVar7] = (long)me->_planarUncBuffer[lVar7];
  }
  uVar10 = 0;
  uVar8 = (ulong)(uint)me->_numChannels;
  if (me->_numChannels < 1) {
    uVar8 = uVar10;
  }
  uVar9 = uVar8;
  for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
    pCVar4 = me->_channelData;
    peVar5 = pCVar4[uVar12].chan;
    iVar1 = peVar5->width;
    iVar2 = peVar5->height;
    lVar7 = (long)peVar5->bytes_per_element;
    sVar13 = (long)iVar2 * (long)iVar1 * lVar7;
    pCVar4[uVar12].planarUncSize = sVar13;
    CVar3 = pCVar4[uVar12].compression;
    puVar6 = (uint8_t *)alStack_48[CVar3];
    pCVar4[uVar12].planarUncBuffer = puVar6;
    pCVar4[uVar12].planarUncBufferEnd = puVar6;
    pCVar4[uVar12].planarUncRle[0] = puVar6;
    pCVar4[uVar12].planarUncRleEnd[0] = puVar6;
    if (puVar6 == (uint8_t *)0x0) {
      for (lVar11 = 0x40; lVar11 + -0x3f < lVar7; lVar11 = lVar11 + 1) {
        *(undefined8 *)((long)(pCVar4->_dctData)._dctData + lVar11 * 8 + (uVar10 - 0x20)) = 0;
        *(undefined8 *)((long)(pCVar4->_dctData)._dctData + lVar11 * 8 + uVar10) = 0;
      }
    }
    else {
      puVar14 = puVar6;
      for (lVar11 = 0x40; puVar14 = puVar14 + iVar2 * iVar1, lVar11 + -0x3f < lVar7;
          lVar11 = lVar11 + 1) {
        *(uint8_t **)((long)(pCVar4->_dctData)._dctData + lVar11 * 8 + (uVar10 - 0x20)) = puVar14;
        *(uint8_t **)((long)(pCVar4->_dctData)._dctData + lVar11 * 8 + uVar10) = puVar14;
      }
    }
    uVar9 = (ulong)peVar5->data_type;
    pCVar4[uVar12].planarUncType = (uint)peVar5->data_type;
    if (CVar3 == LOSSY_DCT) {
      pCVar4[uVar12].planarUncType = EXR_PIXEL_FLOAT;
    }
    else {
      alStack_48[CVar3] = (long)(puVar6 + sVar13);
    }
    uVar10 = uVar10 + 0x240;
  }
  return (exr_result_t)uVar9;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (int c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        if (!cd->planarUncBuffer)
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte]    = 0;
                cd->planarUncRleEnd[byte] = 0;
            }
        }
        else
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte] =
                    cd->planarUncRle[byte - 1] + curc->width * curc->height;

                cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
            }
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}